

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_nabsf128(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_ori_i64_s390x(tcg_ctx,o->out,o->in1,-0x8000000000000000);
  tcg_gen_mov_i64_s390x(tcg_ctx,o->out2,o->in2);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_nabsf128(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_ori_i64(tcg_ctx, o->out, o->in1, 0x8000000000000000ull);
    tcg_gen_mov_i64(tcg_ctx, o->out2, o->in2);
    return DISAS_NEXT;
}